

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkref.c
# Opt level: O3

void * nn_chunkref_getchunk(nn_chunkref *self)

{
  int iVar1;
  void *in_RAX;
  void **ppvVar2;
  void *chunk;
  void *local_18;
  
  ppvVar2 = &local_18;
  if ((ulong)(self->u).ref[0] == 0xff) {
    (self->u).ref[0] = '\0';
    ppvVar2 = (void **)((long)&self->u + 8);
  }
  else {
    local_18 = in_RAX;
    iVar1 = nn_chunk_alloc((ulong)(self->u).ref[0],0,&local_18);
    if (iVar1 != 0) {
      nn_chunkref_getchunk_cold_1();
    }
    memcpy(local_18,(void *)((long)&self->u + 1),(ulong)(self->u).ref[0]);
    (self->u).ref[0] = '\0';
  }
  return *ppvVar2;
}

Assistant:

void *nn_chunkref_getchunk (struct nn_chunkref *self)
{
    int rc;
    struct nn_chunkref_chunk *ch;
    void *chunk;

    if (self->u.ref [0] == 0xff) {
        ch = (struct nn_chunkref_chunk*) self;
        self->u.ref [0] = 0;
        return ch->chunk;
    }

    rc = nn_chunk_alloc (self->u.ref [0], 0, &chunk);
    errno_assert (rc == 0);
    memcpy (chunk, &self->u.ref [1], self->u.ref [0]);
    self->u.ref [0] = 0;
    return chunk;
}